

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall
MeCab::anon_unknown_0::TaggerImpl::parseNBest
          (TaggerImpl *this,size_t N,char *str,size_t len,char *out,size_t len2)

{
  uint uVar1;
  int iVar2;
  Lattice *pLVar3;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  TaggerImpl *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  char *result;
  Lattice *lattice;
  char *in_stack_ffffffffffffffa8;
  char *local_8;
  
  pLVar3 = mutable_lattice(in_RDI);
  (*pLVar3->_vptr_Lattice[10])(pLVar3,in_RDX,in_RCX);
  initRequestType(in_RDI);
  (*pLVar3->_vptr_Lattice[0x14])(pLVar3,2);
  uVar1 = (**(in_RDI->super_Tagger)._vptr_Tagger)(in_RDI,pLVar3);
  if ((uVar1 & 1) == 0) {
    (*pLVar3->_vptr_Lattice[0x24])();
    set_what(in_RDI,in_stack_ffffffffffffffa8);
    local_8 = (char *)0x0;
  }
  else {
    iVar2 = (*pLVar3->_vptr_Lattice[0x1d])(pLVar3,in_RSI,in_R8,in_R9);
    local_8 = (char *)CONCAT44(extraout_var,iVar2);
    if (local_8 == (char *)0x0) {
      (*pLVar3->_vptr_Lattice[0x24])();
      set_what(in_RDI,in_stack_ffffffffffffffa8);
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

const char* TaggerImpl::parseNBest(size_t N, const char* str, size_t len,
                                   char *out, size_t len2) {
  Lattice *lattice = mutable_lattice();
  lattice->set_sentence(str, len);
  initRequestType();
  lattice->add_request_type(MECAB_NBEST);

  if (!parse(lattice)) {
    set_what(lattice->what());
    return 0;
  }

  const char *result = lattice->enumNBestAsString(N, out, len2);
  if (!result) {
    set_what(lattice->what());
    return 0;
  }
  return result;
}